

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UniformLocationTests::~UniformLocationTests(UniformLocationTests *this)

{
  ~UniformLocationTests(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

UniformLocationTests::~UniformLocationTests (void)
{
	for (int i = 0; i < int(structTypes.size()); i++)
		delete structTypes[i];
}